

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O3

void * get_base_component(ecs_world_t *world,ecs_stage_t *stage,ecs_entity_info_t *info,
                         ecs_entity_t component)

{
  ecs_vector_t *vector;
  long lVar1;
  _Bool _Var2;
  int32_t iVar3;
  void *pvVar4;
  void *pvVar5;
  ecs_entity_t component_00;
  long lVar6;
  long lVar7;
  ecs_entity_info_t prefab_info;
  long local_48;
  
  vector = (ecs_vector_t *)**(undefined8 **)&stage->id;
  pvVar4 = _ecs_vector_first(vector,8,0x10);
  lVar6 = -1;
  do {
    iVar3 = ecs_vector_count(vector);
    pvVar5 = _ecs_vector_first(vector,8,0x10);
    lVar7 = lVar6 << 0x20;
    lVar1 = (long)(int)lVar6 + 1;
    do {
      lVar6 = lVar1;
      if (iVar3 <= lVar6) {
        return (void *)0x0;
      }
      lVar7 = lVar7 + 0x100000000;
      lVar1 = lVar6 + 1;
    } while (*(char *)((long)pvVar5 + lVar6 * 8 + 7) != -2);
    if (lVar6 + 1 == 0) {
      return (void *)0x0;
    }
    component_00 = lVar7 >> 0x1d;
    _Var2 = ecs_get_info(world,*(ulong *)((long)pvVar4 + component_00) & 0xffffffffffffff,
                         (ecs_entity_info_t *)&stack0xffffffffffffffb0);
    if (_Var2) {
      pvVar5 = (void *)0x0;
      if (local_48 != 0) {
        pvVar5 = get_component((ecs_entity_info_t *)&stack0xffffffffffffffb0,(ecs_entity_t)info);
        if (pvVar5 != (void *)0x0) {
          return pvVar5;
        }
        pvVar5 = get_base_component(world,(ecs_stage_t *)&stack0xffffffffffffffb0,info,component_00)
        ;
      }
    }
    else {
      pvVar5 = (void *)0x0;
    }
  } while (pvVar5 == (void *)0x0);
  return pvVar5;
}

Assistant:

static
void* get_base_component(
    ecs_world_t * world,
    ecs_stage_t * stage,
    ecs_entity_info_t * info,
    ecs_entity_t component)
{
    ecs_type_t type = info->table->type;
    ecs_entity_t *type_buffer = ecs_vector_first(type, ecs_entity_t);
    int32_t p = -1;
    void *ptr = NULL;

    while (!ptr && (p = find_prefab(type, p)) != -1) {
        ecs_entity_t prefab = type_buffer[p] & ECS_COMPONENT_MASK;
        ecs_entity_info_t prefab_info;
        if (ecs_get_info(world, prefab, &prefab_info) && prefab_info.table) {
            ptr = get_component(&prefab_info, component);
            if (!ptr) {
                ptr = get_base_component(
                    world, stage, &prefab_info, component);
            }
        }
    }

    return ptr;
}